

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_run_conn_shutdown(Curl_easy *data,connectdata *conn,_Bool *done)

{
  _Bool _Var1;
  byte local_2c;
  byte local_2b;
  _Bool local_2a;
  _Bool local_29;
  CURLcode local_28;
  _Bool done2;
  CURLcode CStack_24;
  _Bool done1;
  CURLcode r2;
  CURLcode r1;
  _Bool *done_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  _r2 = done;
  done_local = (_Bool *)conn;
  conn_local = (connectdata *)data;
  cpool_run_conn_shutdown_handler(data,conn);
  if ((*(ulong *)(done_local + 0x3b8) >> 0x20 & 1) == 0) {
    if ((done_local[0x585] == false) &&
       (_Var1 = Curl_conn_is_connected((connectdata *)done_local,0), _Var1)) {
      CStack_24 = Curl_conn_shutdown((Curl_easy *)conn_local,0,&local_29);
    }
    else {
      CStack_24 = CURLE_OK;
      local_29 = true;
    }
    if ((done_local[0x585] == false) &&
       (_Var1 = Curl_conn_is_connected((connectdata *)done_local,1), _Var1)) {
      local_28 = Curl_conn_shutdown((Curl_easy *)conn_local,1,&local_2a);
    }
    else {
      local_28 = CURLE_OK;
      local_2a = true;
    }
    local_2b = 1;
    if ((CStack_24 == CURLE_OK) && (local_2b = 1, local_28 == CURLE_OK)) {
      local_2c = 0;
      if ((local_29 & 1U) != 0) {
        local_2c = local_2a;
      }
      local_2b = local_2c;
    }
    *_r2 = (_Bool)(local_2b & 1);
    if ((*_r2 & 1U) != 0) {
      *(ulong *)(done_local + 0x3b8) =
           *(ulong *)(done_local + 0x3b8) & 0xfffffffeffffffff | 0x100000000;
    }
  }
  else {
    *_r2 = true;
  }
  return;
}

Assistant:

static void cpool_run_conn_shutdown(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    bool *done)
{
  CURLcode r1, r2;
  bool done1, done2;

  /* We expect to be attached when called */
  DEBUGASSERT(data->conn == conn);

  cpool_run_conn_shutdown_handler(data, conn);

  if(conn->bits.shutdown_filters) {
    *done = TRUE;
    return;
  }

  if(!conn->connect_only && Curl_conn_is_connected(conn, FIRSTSOCKET))
    r1 = Curl_conn_shutdown(data, FIRSTSOCKET, &done1);
  else {
    r1 = CURLE_OK;
    done1 = TRUE;
  }

  if(!conn->connect_only && Curl_conn_is_connected(conn, SECONDARYSOCKET))
    r2 = Curl_conn_shutdown(data, SECONDARYSOCKET, &done2);
  else {
    r2 = CURLE_OK;
    done2 = TRUE;
  }

  /* we are done when any failed or both report success */
  *done = (r1 || r2 || (done1 && done2));
  if(*done)
    conn->bits.shutdown_filters = TRUE;
}